

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O0

bool tinyusdz::usda::IsUSDA(string *filename,size_t max_filesize)

{
  bool bVar1;
  uchar *binary;
  size_type length;
  undefined1 local_548 [8];
  AsciiParser parser;
  StreamReader sr;
  undefined1 local_58 [8];
  string err;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  size_t max_filesize_local;
  string *filename_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&err.field_2 + 8));
  ::std::__cxx11::string::string((string *)local_58);
  bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            ((long)&err.field_2 + 8),(string *)local_58,filename,max_filesize,
                            (void *)0x0);
  if (bVar1) {
    binary = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        ((long)&err.field_2 + 8));
    length = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        ((long)&err.field_2 + 8));
    StreamReader::StreamReader((StreamReader *)&parser._primspec_fun._M_invoker,binary,length,false)
    ;
    ascii::AsciiParser::AsciiParser
              ((AsciiParser *)local_548,(StreamReader *)&parser._primspec_fun._M_invoker);
    filename_local._7_1_ = ascii::AsciiParser::CheckHeader((AsciiParser *)local_548);
    ascii::AsciiParser::~AsciiParser((AsciiParser *)local_548);
  }
  else {
    filename_local._7_1_ = false;
  }
  ::std::__cxx11::string::~string((string *)local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&err.field_2 + 8));
  return filename_local._7_1_;
}

Assistant:

bool IsUSDA(const std::string &filename, size_t max_filesize) {
  // TODO: Read only first N bytes
  std::vector<uint8_t> data;
  std::string err;

  if (!io::ReadWholeFile(&data, &err, filename, max_filesize)) {
    return false;
  }

  tinyusdz::StreamReader sr(data.data(), data.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  return parser.CheckHeader();
}